

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction *
pbrt::Triangle::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,TriangleMesh *mesh,int triIndex,
          TriangleIntersection *ti,Float time,Vector3f *wo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 uVar17;
  ulong uVar14;
  undefined8 uVar15;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  ulong uVar16;
  undefined4 uVar26;
  undefined4 uVar27;
  int iVar28;
  int iVar29;
  Point3f *pPVar30;
  Point2f *pPVar31;
  Normal3f *pNVar32;
  Vector3f *pVVar33;
  double dVar34;
  undefined1 auVar35 [16];
  float fVar36;
  Point3fi pi;
  Normal3f dndvs;
  SurfaceInteraction *this;
  int iVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined4 uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  Vector3f dpdu;
  Vector3f dpdv;
  Normal3f ns;
  Vector3f dpdus;
  Vector3f dpdvs;
  Normal3f dndus;
  int vb;
  undefined4 local_198;
  float va;
  undefined4 uStack_18c;
  undefined4 local_188;
  float local_184;
  float local_180;
  Float local_17c;
  undefined8 local_178;
  float local_170;
  SurfaceInteraction *local_168;
  TriangleIntersection *local_160;
  long local_158;
  int *local_150;
  Tuple3<pbrt::Point3,_float> local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_58;
  Point3fi local_48;
  
  local_150 = mesh->vertexIndices;
  pPVar30 = mesh->p;
  local_158 = (long)(triIndex * 3);
  iVar37 = local_150[local_158];
  iVar28 = local_150[local_158 + 1];
  iVar29 = local_150[local_158 + 2];
  fVar60 = pPVar30[iVar37].super_Tuple3<pbrt::Point3,_float>.z;
  fVar75 = pPVar30[iVar28].super_Tuple3<pbrt::Point3,_float>.z;
  uVar12._0_4_ = pPVar30[iVar28].super_Tuple3<pbrt::Point3,_float>.x;
  uVar12._4_4_ = pPVar30[iVar28].super_Tuple3<pbrt::Point3,_float>.y;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar12;
  uVar13._0_4_ = pPVar30[iVar37].super_Tuple3<pbrt::Point3,_float>.x;
  uVar13._4_4_ = pPVar30[iVar37].super_Tuple3<pbrt::Point3,_float>.y;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar13;
  uVar1 = pPVar30[iVar29].super_Tuple3<pbrt::Point3,_float>.x;
  uVar17 = pPVar30[iVar29].super_Tuple3<pbrt::Point3,_float>.y;
  auVar51._4_4_ = uVar17;
  auVar51._0_4_ = uVar1;
  auVar51._8_8_ = 0;
  fVar85 = pPVar30[iVar29].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar31 = mesh->uv;
  if (pPVar31 == (Point2f *)0x0) {
    fVar68 = 1.0;
    auVar52 = ZEXT816(0) << 0x40;
    auVar53 = ZEXT816(0) << 0x40;
    fVar54 = 0.0;
    fVar74 = fVar68;
    fVar36 = fVar68;
  }
  else {
    fVar54 = pPVar31[iVar37].super_Tuple2<pbrt::Point2,_float>.x;
    auVar53 = ZEXT416((uint)pPVar31[iVar37].super_Tuple2<pbrt::Point2,_float>.y);
    fVar68 = pPVar31[iVar28].super_Tuple2<pbrt::Point2,_float>.x;
    auVar52 = ZEXT416((uint)pPVar31[iVar28].super_Tuple2<pbrt::Point2,_float>.y);
    fVar74 = pPVar31[iVar29].super_Tuple2<pbrt::Point2,_float>.y;
    fVar36 = pPVar31[iVar29].super_Tuple2<pbrt::Point2,_float>.x;
  }
  auVar55 = ZEXT416((uint)fVar74);
  local_108 = vsubss_avx512f(auVar53,auVar55);
  local_118 = vsubss_avx512f(auVar52,auVar55);
  local_78 = vsubps_avx512vl(auVar48,auVar51);
  auVar40 = vsubss_avx512f(ZEXT416((uint)fVar60),ZEXT416((uint)fVar85));
  local_68 = vsubps_avx512vl(auVar47,auVar51);
  auVar41 = vsubss_avx512f(ZEXT416((uint)fVar75),ZEXT416((uint)fVar85));
  local_f8 = ZEXT416((uint)(fVar68 - fVar36));
  auVar42 = vmulss_avx512f(local_108,local_f8);
  local_e8 = ZEXT416((uint)(fVar54 - fVar36));
  auVar44 = vfmsub213ss_fma(local_118,local_e8,auVar42);
  auVar43._8_4_ = 0x80000000;
  auVar43._0_8_ = 0x8000000080000000;
  auVar43._12_4_ = 0x80000000;
  local_128 = vxorps_avx512vl(local_108,auVar43);
  auVar43 = vfnmadd231ss_avx512f(auVar42,local_108,ZEXT416((uint)(fVar68 - fVar36)));
  fVar74 = auVar44._0_4_ + auVar43._0_4_;
  auVar44._8_4_ = 0x7fffffff;
  auVar44._0_8_ = 0x7fffffff7fffffff;
  auVar44._12_4_ = 0x7fffffff;
  local_138 = ZEXT416((uint)fVar74);
  local_d8 = vandps_avx512vl(local_138,auVar44);
  fVar84 = local_d8._0_4_;
  bVar38 = NAN(fVar84);
  bVar39 = fVar84 == 1e-09;
  if (fVar84 < 1e-09) {
LAB_00221344:
    auVar47 = vsubps_avx512vl(auVar47,auVar48);
    fVar84 = fVar85 - fVar60;
    auVar44 = vsubps_avx512vl(auVar51,auVar48);
    fVar88 = fVar75 - fVar60;
    auVar43 = vmovshdup_avx512vl(auVar47);
    auVar42 = vmovshdup_avx512vl(auVar44);
    auVar48 = vmulss_avx512f(auVar43,ZEXT416((uint)fVar84));
    auVar45 = vfmsub213ss_avx512f(ZEXT416((uint)fVar88),auVar42,auVar48);
    auVar48 = vfnmadd231ss_avx512f(auVar48,ZEXT416((uint)fVar84),auVar43);
    auVar45 = vaddss_avx512f(auVar45,auVar48);
    auVar46 = vmulss_avx512f(ZEXT416((uint)fVar88),auVar44);
    auVar48 = vfmsub213ss_fma(auVar47,ZEXT416((uint)fVar84),auVar46);
    auVar46 = vfnmadd231ss_avx512f(auVar46,auVar44,ZEXT416((uint)fVar88));
    auVar48 = vaddss_avx512f(auVar46,auVar48);
    auVar46 = vmulss_avx512f(auVar47,auVar42);
    auVar49 = vfmsub213ss_avx512f(auVar43,auVar44,auVar46);
    auVar46 = vfnmadd231ss_avx512f(auVar46,auVar42,auVar47);
    auVar50 = vmulss_avx512f(auVar48,auVar48);
    fVar74 = auVar49._0_4_ + auVar46._0_4_;
    auVar81 = ZEXT416((uint)fVar74);
    auVar46 = vmulss_avx512f(auVar45,auVar45);
    auVar46 = vaddss_avx512f(auVar50,auVar46);
    auVar49 = vmulss_avx512f(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
    vaddss_avx512f(auVar49,auVar46);
    vucomiss_avx512f(ZEXT816(0) << 0x20);
    if ((!bVar39) || (bVar38)) {
      auVar48 = vinsertps_avx512f(auVar45,auVar48,0x10);
    }
    else {
      auVar91._0_8_ = (double)fVar84;
      auVar91._8_8_ = 0;
      auVar48 = vcvtss2sd_avx512f(auVar43,auVar43);
      auVar44 = vcvtss2sd_avx512f(auVar44,auVar44);
      auVar43 = vcvtss2sd_avx512f(auVar42,auVar42);
      auVar96._0_8_ = (double)fVar88;
      auVar96._8_8_ = 0;
      auVar47 = vcvtss2sd_avx512f(auVar47,auVar47);
      _vb = _vb & 0xffffffff00000000;
      auVar42 = vmulsd_avx512f(auVar48,auVar91);
      auVar45 = vfmsub213sd_avx512f(auVar96,auVar43,auVar42);
      auVar42 = vfnmadd231sd_avx512f(auVar42,auVar91,auVar48);
      auVar42 = vaddsd_avx512f(auVar45,auVar42);
      auVar45 = vmulsd_avx512f(auVar96,auVar44);
      auVar46 = vfmsub213sd_avx512f(auVar91,auVar47,auVar45);
      auVar45 = vfnmadd213sd_avx512f(auVar96,auVar44,auVar45);
      dVar34 = auVar45._0_8_ + auVar46._0_8_;
      auVar45 = vmulsd_avx512f(auVar47,auVar43);
      auVar48 = vfmsub213sd_avx512f(auVar48,auVar44,auVar45);
      auVar47 = vfnmadd213sd_avx512f(auVar47,auVar43,auVar45);
      auVar44 = vcvtsd2ss_avx512f(auVar42,auVar42);
      auVar45._0_4_ = (float)dVar34;
      auVar45._4_4_ = (int)((ulong)dVar34 >> 0x20);
      auVar45._8_8_ = 0;
      auVar43 = vmulss_avx512f(auVar44,auVar44);
      auVar48 = vaddsd_avx512f(auVar48,auVar47);
      auVar47 = vmulss_avx512f(auVar45,auVar45);
      auVar81._0_4_ = (float)auVar48._0_8_;
      auVar81._4_12_ = auVar48._4_12_;
      auVar48 = vaddss_avx512f(auVar47,auVar43);
      auVar49 = vmulss_avx512f(auVar81,auVar81);
      vaddss_avx512f(auVar49,auVar48);
      auVar48 = vucomiss_avx512f(ZEXT816(0) << 0x20);
      _va = CONCAT44(uStack_18c,auVar48._0_4_);
      if ((bVar39) && (!bVar38)) {
        LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                   ,0x38f,"Check failed: %s != %s with %s = %s, %s = %s",
                   (char (*) [18])"LengthSquared(ng)",(char (*) [2])0x286cc03,
                   (char (*) [18])"LengthSquared(ng)",&va,(char (*) [2])0x286cc03,&vb);
      }
      auVar48 = vinsertps_avx(auVar44,auVar45,0x10);
    }
    auVar92._0_4_ = auVar48._0_4_ * auVar48._0_4_;
    auVar92._4_4_ = auVar48._4_4_ * auVar48._4_4_;
    auVar92._8_4_ = auVar48._8_4_ * auVar48._8_4_;
    auVar92._12_4_ = auVar48._12_4_ * auVar48._12_4_;
    auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    auVar47 = vhaddps_avx(auVar92,auVar92);
    auVar47 = vaddss_avx512f(auVar49,auVar47);
    auVar47 = vsqrtss_avx(auVar47,auVar47);
    fVar74 = auVar47._0_4_;
    auVar82._0_4_ = auVar81._0_4_ / fVar74;
    auVar82._4_12_ = auVar81._4_12_;
    auVar97._4_4_ = fVar74;
    auVar97._0_4_ = fVar74;
    auVar97._8_4_ = fVar74;
    auVar97._12_4_ = fVar74;
    auVar93._8_4_ = 0x80000000;
    auVar93._0_8_ = 0x8000000080000000;
    auVar93._12_4_ = 0x80000000;
    auVar48 = vdivps_avx(auVar48,auVar97);
    auVar47 = vmovdqa64_avx512vl(auVar44);
    auVar47 = vpternlogd_avx512vl(auVar47,auVar82,auVar93,0xf8);
    auVar43 = vmulss_avx512f(auVar48,auVar47);
    auVar42 = vdivss_avx512f(ZEXT416(0xbf800000),ZEXT416((uint)(auVar82._0_4_ + auVar47._0_4_)));
    auVar45 = vmovshdup_avx512vl(auVar48);
    auVar46 = vmulss_avx512f(auVar48,auVar45);
    auVar43 = vmulss_avx512f(auVar48,auVar43);
    auVar46 = vmulss_avx512f(auVar46,auVar42);
    auVar44 = vfmadd213ss_avx512f(auVar43,auVar42,auVar44);
    auVar43 = vmulss_avx512f(auVar47,auVar46);
    local_88 = vinsertps_avx512f(auVar44,auVar43,0x10);
    auVar44 = vpxord_avx512vl(auVar47,auVar93);
    local_98 = vmulss_avx512f(auVar48,auVar44);
    auVar48 = vmulss_avx512f(auVar45,auVar45);
    local_a8 = vxorps_avx512vl(auVar45,auVar93);
    auVar48 = vfmadd213ss_fma(auVar48,auVar42,auVar47);
    local_b8 = vinsertps_avx512f(auVar46,auVar48,0x10);
  }
  else {
    auVar49._0_4_ = 1.0 / fVar74;
    auVar49._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar44 = vmulss_avx512f(auVar41,local_108);
    auVar43 = vfmsub213ss_avx512f(auVar40,local_118,auVar44);
    auVar44 = vfmadd231ss_avx512f(auVar44,local_128,auVar41);
    uVar95 = local_108._0_4_;
    auVar46._4_4_ = uVar95;
    auVar46._0_4_ = uVar95;
    auVar46._8_4_ = uVar95;
    auVar46._12_4_ = uVar95;
    auVar42 = vbroadcastss_avx512vl(local_118);
    auVar45 = vbroadcastss_avx512vl(local_128);
    auVar46 = vmulps_avx512vl(local_68,auVar46);
    local_98 = vmulss_avx512f(ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_)),auVar49);
    auVar44 = vbroadcastss_avx512vl(local_f8);
    auVar43 = vfmsub213ps_avx512vl(auVar42,local_78,auVar46);
    auVar42 = vfmadd213ps_avx512vl(auVar45,local_68,auVar46);
    auVar43 = vaddps_avx512vl(auVar42,auVar43);
    auVar42 = vmulss_avx512f(auVar40,local_f8);
    auVar50._4_4_ = auVar49._0_4_;
    auVar50._0_4_ = auVar49._0_4_;
    auVar50._8_4_ = auVar49._0_4_;
    auVar50._12_4_ = auVar49._0_4_;
    auVar45 = vfmsub213ss_avx512f(auVar41,local_e8,auVar42);
    auVar42 = vfnmadd231ss_avx512f(auVar42,local_f8,auVar40);
    local_88 = vmulps_avx512vl(auVar43,auVar50);
    auVar43 = vmulps_avx512vl(local_78,auVar44);
    auVar44 = vfnmadd213ps_avx512vl(auVar44,local_78,auVar43);
    auVar42 = vaddss_avx512f(auVar45,auVar42);
    auVar45 = vbroadcastss_avx512vl(local_e8);
    auVar43 = vfmsub213ps_avx512vl(auVar45,local_68,auVar43);
    local_a8 = vmulss_avx512f(auVar42,auVar49);
    auVar44 = vaddps_avx512vl(auVar43,auVar44);
    auVar43 = vmulss_avx512f(local_a8,local_88);
    local_b8 = vmulps_avx512vl(auVar44,auVar50);
    auVar44 = vfmsub213ss_avx512f(local_b8,local_98,auVar43);
    auVar43 = vfnmadd231ss_avx512f(auVar43,local_88,local_a8);
    fVar74 = auVar44._0_4_ + auVar43._0_4_;
    auVar44 = vpermt2ps_avx512vl(local_88,_DAT_00447c50,local_98);
    auVar43 = vpermi2ps_avx512vl(_DAT_00447c50,local_b8,local_a8);
    auVar42 = vmulps_avx512vl(auVar44,local_b8);
    auVar43 = vfmsub213ps_avx512vl(auVar43,local_88,auVar42);
    auVar44 = vfnmadd213ps_avx512vl(auVar44,local_b8,auVar42);
    fVar84 = auVar43._0_4_ + auVar44._0_4_;
    fVar88 = auVar43._4_4_ + auVar44._4_4_;
    fVar89 = auVar43._8_4_ + auVar44._8_4_;
    fVar90 = auVar43._12_4_ + auVar44._12_4_;
    auVar42._0_4_ = fVar84 * fVar84;
    auVar42._4_4_ = fVar88 * fVar88;
    auVar42._8_4_ = fVar89 * fVar89;
    auVar42._12_4_ = fVar90 * fVar90;
    auVar44 = vmovshdup_avx(auVar42);
    fVar74 = auVar42._0_4_ + auVar44._0_4_ + fVar74 * fVar74;
    bVar38 = NAN(fVar74);
    bVar39 = fVar74 == 0.0;
    if ((bVar39) && (!bVar38)) goto LAB_00221344;
  }
  fVar74 = ti->b1;
  fVar84 = ti->b0;
  auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)ti->b2));
  iVar37 = 0;
  local_184 = auVar41._0_4_;
  local_180 = auVar40._0_4_;
  auVar41._0_4_ = fVar84 * (float)(undefined4)uVar13;
  auVar41._4_4_ = fVar84 * (float)uVar13._4_4_;
  auVar41._8_4_ = fVar84 * 0.0;
  auVar41._12_4_ = fVar84 * 0.0;
  auVar86._0_4_ = fVar74 * (float)(undefined4)uVar12;
  auVar86._4_4_ = fVar74 * (float)uVar12._4_4_;
  auVar86._8_4_ = fVar74 * 0.0;
  auVar86._12_4_ = fVar74 * 0.0;
  auVar47 = vmulps_avx512vl(auVar51,auVar48);
  auVar51 = vmulss_avx512f(ZEXT416((uint)fVar85),auVar48);
  auVar44 = vmulss_avx512f(auVar55,auVar48);
  auVar43 = vaddss_avx512f(ZEXT416((uint)(fVar84 * fVar60)),ZEXT416((uint)(fVar75 * fVar74)));
  auVar40._0_4_ = auVar41._0_4_ + auVar86._0_4_ + auVar47._0_4_;
  auVar40._4_4_ = auVar41._4_4_ + auVar86._4_4_ + auVar47._4_4_;
  auVar40._8_4_ = auVar41._8_4_ + auVar86._8_4_ + auVar47._8_4_;
  auVar40._12_4_ = auVar41._12_4_ + auVar86._12_4_ + auVar47._12_4_;
  auVar43 = vaddss_avx512f(auVar43,auVar51);
  local_148._0_8_ = vmovlps_avx(auVar40);
  local_148.z = auVar43._0_4_;
  auVar48 = vmulss_avx512f(ZEXT416((uint)fVar36),auVar48);
  local_c8 = vinsertps_avx(ZEXT416((uint)(fVar68 * fVar74 + fVar54 * fVar84 + auVar48._0_4_)),
                           ZEXT416((uint)(auVar53._0_4_ * fVar84 + fVar74 * auVar52._0_4_ +
                                         auVar44._0_4_)),0x10);
  if (mesh->faceIndices != (int *)0x0) {
    iVar37 = mesh->faceIndices[triIndex];
  }
  auVar55._8_4_ = 0x7fffffff;
  auVar55._0_8_ = 0x7fffffff7fffffff;
  auVar55._12_4_ = 0x7fffffff;
  bVar38 = mesh->reverseOrientation;
  bVar39 = mesh->transformSwapsHandedness;
  auVar48 = vandps_avx(auVar41,auVar55);
  auVar52 = vandps_avx(auVar86,auVar55);
  auVar47 = vandps_avx(auVar47,auVar55);
  auVar53 = vandps_avx(ZEXT416((uint)(fVar84 * fVar60)),auVar55);
  auVar58._0_4_ = auVar48._0_4_ + auVar52._0_4_ + auVar47._0_4_;
  auVar58._4_4_ = auVar48._4_4_ + auVar52._4_4_ + auVar47._4_4_;
  auVar58._8_4_ = auVar48._8_4_ + auVar52._8_4_ + auVar47._8_4_;
  auVar58._12_4_ = auVar48._12_4_ + auVar52._12_4_ + auVar47._12_4_;
  auVar48 = vandps_avx(ZEXT416((uint)(fVar75 * fVar74)),auVar55);
  auVar47 = vandps_avx(auVar51,auVar55);
  auVar52._8_4_ = 0x34e00006;
  auVar52._0_8_ = 0x34e0000634e00006;
  auVar52._12_4_ = 0x34e00006;
  auVar51 = vmulps_avx512vl(auVar58,auVar52);
  local_58.z = (auVar53._0_4_ + auVar48._0_4_ + auVar47._0_4_) * 4.1723268e-07;
  local_58._0_8_ = vmovlps_avx(auVar51);
  local_17c = time;
  local_168 = __return_storage_ptr__;
  local_160 = ti;
  Point3fi::Point3fi(&local_48,(Point3f *)&local_148,(Vector3f *)&local_58);
  auVar47 = local_88;
  auVar48 = local_b8;
  this = local_168;
  _va = 0;
  _vb = 0;
  local_188 = 0;
  local_198 = 0;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_98._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_88._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_88._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_a8._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_b8._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
  local_b8 = auVar48;
  local_88 = auVar47;
  SurfaceInteraction::SurfaceInteraction
            (local_168,pi,(Point2f)local_c8._0_8_,(Vector3f)wo->super_Tuple3<pbrt::Vector3,_float>,
             dpdu,dpdv,(Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),local_17c,bVar38 != bVar39);
  this->faceIndex = iVar37;
  auVar48 = vmovshdup_avx(local_68);
  auVar47 = vmovshdup_avx(local_78);
  auVar52 = ZEXT416((uint)(auVar48._0_4_ * local_180));
  auVar51 = vfmsub213ss_fma(ZEXT416((uint)local_184),auVar47,auVar52);
  auVar52 = vfnmadd231ss_fma(auVar52,ZEXT416((uint)local_180),auVar48);
  fVar60 = auVar51._0_4_ + auVar52._0_4_;
  auVar52 = ZEXT416((uint)(local_78._0_4_ * local_184));
  auVar51 = vfmsub213ss_fma(ZEXT416((uint)local_180),local_68,auVar52);
  auVar52 = vfnmadd213ss_fma(ZEXT416((uint)local_184),local_78,auVar52);
  fVar75 = auVar51._0_4_ + auVar52._0_4_;
  auVar51 = ZEXT416((uint)(local_68._0_4_ * auVar47._0_4_));
  auVar47 = vfnmadd213ss_fma(local_68,auVar47,auVar51);
  auVar48 = vfmsub213ss_fma(auVar48,local_78,auVar51);
  fVar85 = auVar48._0_4_ + auVar47._0_4_;
  auVar48 = ZEXT416((uint)(fVar85 * fVar85 + fVar60 * fVar60 + fVar75 * fVar75));
  auVar48 = vsqrtss_avx(auVar48,auVar48);
  fVar54 = auVar48._0_4_;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar60 / fVar54;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar75 / fVar54;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = fVar85 / fVar54;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar60 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar60;
  if (mesh->reverseOrientation != mesh->transformSwapsHandedness) {
    uVar14._0_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14._4_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    fVar60 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar53._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar53._8_4_ = 0x80000000;
    auVar53._12_4_ = 0x80000000;
    uVar15 = vmovlps_avx(auVar53);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar15;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = -fVar60;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar60 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
         (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar60;
  }
  pNVar32 = mesh->n;
  if (pNVar32 == (Normal3f *)0x0) {
    if (mesh->s == (Vector3f *)0x0) {
      return this;
    }
LAB_00221944:
    uVar5 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar21 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar57._4_4_ = uVar21;
    auVar57._0_4_ = uVar5;
    auVar57._8_8_ = 0;
    auVar59 = ZEXT416((uint)(this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z);
  }
  else {
    fVar60 = local_160->b0;
    fVar75 = local_160->b1;
    uVar2 = pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar18 = pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar3 = pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar19 = pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    fVar85 = local_160->b2;
    uVar4 = pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar20 = pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    fVar54 = fVar60 * pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.z +
             fVar75 * pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.z +
             fVar85 * pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    auVar56._0_4_ = fVar60 * (float)uVar2 + fVar75 * (float)uVar3 + fVar85 * (float)uVar4;
    auVar56._4_4_ = fVar60 * (float)uVar18 + fVar75 * (float)uVar19 + fVar85 * (float)uVar20;
    auVar56._8_4_ = fVar60 * 0.0 + fVar75 * 0.0 + fVar85 * 0.0;
    auVar56._12_4_ = fVar60 * 0.0 + fVar75 * 0.0 + fVar85 * 0.0;
    auVar61._0_4_ = auVar56._0_4_ * auVar56._0_4_;
    auVar61._4_4_ = auVar56._4_4_ * auVar56._4_4_;
    auVar61._8_4_ = auVar56._8_4_ * auVar56._8_4_;
    auVar61._12_4_ = auVar56._12_4_ * auVar56._12_4_;
    auVar48 = vhaddps_avx(auVar61,auVar61);
    fVar60 = auVar48._0_4_ + fVar54 * fVar54;
    if (fVar60 <= 0.0) goto LAB_00221944;
    auVar48 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    fVar60 = auVar48._0_4_;
    auVar64._4_4_ = fVar60;
    auVar64._0_4_ = fVar60;
    auVar64._8_4_ = fVar60;
    auVar64._12_4_ = fVar60;
    auVar59._0_4_ = fVar54 / fVar60;
    auVar59._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar57 = vdivps_avx(auVar56,auVar64);
  }
  pVVar33 = mesh->s;
  if (pVVar33 != (Vector3f *)0x0) {
    fVar60 = local_160->b0;
    fVar75 = local_160->b1;
    uVar6 = pVVar33[local_150[local_158]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar22 = pVVar33[local_150[local_158]].super_Tuple3<pbrt::Vector3,_float>.y;
    uVar7 = pVVar33[local_150[local_158 + 1]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar23 = pVVar33[local_150[local_158 + 1]].super_Tuple3<pbrt::Vector3,_float>.y;
    fVar85 = local_160->b2;
    uVar8 = pVVar33[local_150[local_158 + 2]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar24 = pVVar33[local_150[local_158 + 2]].super_Tuple3<pbrt::Vector3,_float>.y;
    auVar62._0_4_ = fVar60 * (float)uVar6 + fVar75 * (float)uVar7 + fVar85 * (float)uVar8;
    auVar62._4_4_ = fVar60 * (float)uVar22 + fVar75 * (float)uVar23 + fVar85 * (float)uVar24;
    auVar62._8_4_ = fVar60 * 0.0 + fVar75 * 0.0 + fVar85 * 0.0;
    auVar62._12_4_ = fVar60 * 0.0 + fVar75 * 0.0 + fVar85 * 0.0;
    auVar66._0_4_ = auVar62._0_4_ * auVar62._0_4_;
    auVar66._4_4_ = auVar62._4_4_ * auVar62._4_4_;
    auVar66._8_4_ = auVar62._8_4_ * auVar62._8_4_;
    auVar66._12_4_ = auVar62._12_4_ * auVar62._12_4_;
    auVar48 = vhaddps_avx(auVar66,auVar66);
    fVar60 = fVar60 * pVVar33[local_150[local_158]].super_Tuple3<pbrt::Vector3,_float>.z +
             fVar75 * pVVar33[local_150[local_158 + 1]].super_Tuple3<pbrt::Vector3,_float>.z +
             fVar85 * pVVar33[local_150[local_158 + 2]].super_Tuple3<pbrt::Vector3,_float>.z;
    auVar47 = ZEXT416((uint)fVar60);
    fVar60 = auVar48._0_4_ + fVar60 * fVar60;
    if ((fVar60 != 0.0) || (NAN(fVar60))) goto LAB_002219e9;
  }
  uVar9 = (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar25 = (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar62._4_4_ = (float)uVar25;
  auVar62._0_4_ = (float)uVar9;
  auVar62._8_8_ = 0;
  auVar47 = ZEXT416((uint)(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.z);
LAB_002219e9:
  auVar48 = vmovshdup_avx(auVar62);
  auVar51 = vmovshdup_avx(auVar57);
  ns.super_Tuple3<pbrt::Normal3,_float>.z = auVar59._0_4_;
  auVar53 = ZEXT416((uint)(ns.super_Tuple3<pbrt::Normal3,_float>.z * auVar48._0_4_));
  auVar52 = vfmsub213ss_fma(auVar47,auVar51,auVar53);
  auVar53 = vfnmadd231ss_fma(auVar53,auVar59,auVar48);
  fVar60 = auVar52._0_4_ + auVar53._0_4_;
  fVar54 = auVar57._0_4_;
  auVar53 = ZEXT416((uint)(fVar54 * auVar47._0_4_));
  auVar52 = vfmsub213ss_fma(auVar62,auVar59,auVar53);
  auVar47 = vfnmadd213ss_fma(auVar47,auVar57,auVar53);
  fVar75 = auVar52._0_4_ + auVar47._0_4_;
  fVar68 = auVar51._0_4_;
  auVar47 = ZEXT416((uint)(fVar68 * auVar62._0_4_));
  auVar48 = vfmsub213ss_fma(auVar48,auVar57,auVar47);
  auVar47 = vfnmadd213ss_fma(auVar62,auVar51,auVar47);
  fVar85 = auVar48._0_4_ + auVar47._0_4_;
  auVar67 = ZEXT464((uint)fVar85);
  if (fVar85 * fVar85 + fVar60 * fVar60 + fVar75 * fVar75 <= 0.0) {
    auVar63._8_4_ = 0x3f800000;
    auVar63._0_8_ = 0x3f8000003f800000;
    auVar63._12_4_ = 0x3f800000;
    auVar65._8_4_ = 0x80000000;
    auVar65._0_8_ = 0x8000000080000000;
    auVar65._12_4_ = 0x80000000;
    auVar35._8_4_ = 0x80000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar35._12_4_ = 0x80000000;
    auVar48 = vxorps_avx512vl(auVar51,auVar35);
    auVar67 = ZEXT1664(auVar48);
    auVar47 = vpternlogd_avx512vl(auVar63,auVar59,auVar65,0xf8);
    fVar85 = auVar47._0_4_;
    fVar60 = fVar54 * -fVar85;
    fVar74 = -1.0 / (ns.super_Tuple3<pbrt::Normal3,_float>.z + fVar85);
    fVar75 = fVar54 * fVar68 * fVar74;
    auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar54 * fVar85 * fVar54)),ZEXT416((uint)fVar74),
                              auVar63);
    auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar74),auVar47);
    auVar47 = vinsertps_avx(ZEXT416((uint)fVar75),auVar47,0x10);
    auVar48 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar75 * fVar85)),0x10);
  }
  else {
    auVar53 = ZEXT416((uint)fVar60);
    auVar40 = ZEXT416((uint)fVar75);
    auVar47 = vinsertps_avx(auVar53,auVar40,0x10);
    auVar48 = vfmsub213ss_fma(auVar59,auVar40,ZEXT416((uint)(fVar68 * fVar85)));
    auVar44 = vfnmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar85)),ZEXT416((uint)fVar85),auVar51);
    auVar52 = vfmsub213ss_fma(auVar57,ZEXT416((uint)fVar85),
                              ZEXT416((uint)(ns.super_Tuple3<pbrt::Normal3,_float>.z * fVar60)));
    auVar43 = vfnmadd231ss_fma(ZEXT416((uint)(ns.super_Tuple3<pbrt::Normal3,_float>.z * fVar60)),
                               auVar53,auVar59);
    auVar51 = vfmsub213ss_fma(auVar53,auVar51,ZEXT416((uint)(fVar54 * fVar75)));
    auVar53 = vfnmadd213ss_fma(auVar40,auVar57,ZEXT416((uint)(fVar54 * fVar75)));
    auVar48 = vinsertps_avx(ZEXT416((uint)(auVar48._0_4_ + auVar44._0_4_)),
                            ZEXT416((uint)(auVar52._0_4_ + auVar43._0_4_)),0x10);
    fVar60 = auVar51._0_4_ + auVar53._0_4_;
  }
  auVar77 = ZEXT816(0);
  if (pNVar32 == (Normal3f *)0x0) {
    local_170 = 0.0;
    auVar73 = ZEXT864(0) << 0x20;
    fVar75 = 0.0;
  }
  else {
    fVar75 = pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar85 = pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar54 = pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16._0_4_ = pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16._4_4_ = pNVar32[local_150[local_158]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar16;
    uVar10 = pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar26 = pNVar32[local_150[local_158 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar80._4_4_ = uVar26;
    auVar80._0_4_ = uVar10;
    auVar80._8_8_ = 0;
    uVar11 = pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar27 = pNVar32[local_150[local_158 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    auVar79._4_4_ = uVar27;
    auVar79._0_4_ = uVar11;
    auVar79._8_8_ = 0;
    if (1e-09 <= (float)local_d8._0_4_) {
      auVar51 = vmovshdup_avx(auVar79);
      fVar68 = auVar51._0_4_ - fVar85;
      fVar75 = fVar75 - fVar85;
      fVar85 = 1.0 / (float)local_138._0_4_;
      auVar51 = vmulss_avx512f(local_108,ZEXT416((uint)fVar68));
      auVar52 = vfmsub213ss_avx512f(ZEXT416((uint)fVar75),local_118,auVar51);
      auVar51 = vfmadd213ss_fma(local_128,ZEXT416((uint)fVar68),auVar51);
      auVar53 = vmulss_avx512f(local_f8,ZEXT416((uint)fVar75));
      auVar40 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar75),local_f8,auVar53);
      fVar75 = fVar85 * (auVar52._0_4_ + auVar51._0_4_);
      auVar43 = vfmsub213ss_fma(ZEXT416((uint)fVar68),local_e8,auVar53);
      auVar98._0_4_ = local_e8._0_4_;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar52 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar79,ZEXT416((uint)fVar54));
      auVar51 = vsubps_avx(auVar69,auVar80);
      auVar53 = vbroadcastss_avx512vl(local_108);
      auVar44 = vbroadcastss_avx512vl(local_118);
      auVar52 = vsubps_avx(auVar52,auVar80);
      auVar41 = vbroadcastss_avx512vl(local_128);
      auVar72._0_4_ = auVar52._0_4_ * auVar53._0_4_;
      auVar72._4_4_ = auVar52._4_4_ * auVar53._4_4_;
      auVar72._8_4_ = auVar52._8_4_ * auVar53._8_4_;
      auVar72._12_4_ = auVar52._12_4_ * auVar53._12_4_;
      auVar44 = vfmsub213ps_fma(auVar44,auVar51,auVar72);
      auVar53 = vfmadd213ps_fma(auVar41,auVar52,auVar72);
      auVar41 = vbroadcastss_avx512vl(local_f8);
      auVar94._0_4_ = auVar41._0_4_ * auVar51._0_4_;
      auVar94._4_4_ = auVar41._4_4_ * auVar51._4_4_;
      auVar94._8_4_ = auVar41._8_4_ * auVar51._8_4_;
      auVar94._12_4_ = auVar41._12_4_ * auVar51._12_4_;
      auVar73 = ZEXT1664(CONCAT412(fVar85 * (auVar44._12_4_ + auVar53._12_4_),
                                   CONCAT48(fVar85 * (auVar44._8_4_ + auVar53._8_4_),
                                            CONCAT44(fVar85 * (auVar44._4_4_ + auVar53._4_4_),
                                                     fVar85 * (auVar44._0_4_ + auVar53._0_4_)))));
      auVar53 = vfnmadd213ps_fma(auVar51,auVar41,auVar94);
      auVar51 = vfmsub213ps_fma(auVar98,auVar52,auVar94);
      local_170 = fVar85 * (auVar40._0_4_ + auVar43._0_4_);
      auVar77._0_4_ = fVar85 * (auVar53._0_4_ + auVar51._0_4_);
      auVar77._4_4_ = fVar85 * (auVar53._4_4_ + auVar51._4_4_);
      auVar77._8_4_ = fVar85 * (auVar53._8_4_ + auVar51._8_4_);
      auVar77._12_4_ = fVar85 * (auVar53._12_4_ + auVar51._12_4_);
    }
    else {
      auVar52 = vsubps_avx(auVar80,auVar69);
      auVar51 = vpermt2ps_avx512vl(auVar69,_DAT_00447c50,ZEXT416((uint)fVar75));
      auVar43 = vpermi2ps_avx512vl(_DAT_00447c50,auVar52,ZEXT416((uint)(fVar85 - fVar75)));
      auVar53 = vsubps_avx(auVar79,auVar51);
      auVar51 = vmovshdup_avx(auVar53);
      auVar44 = ZEXT416((uint)(fVar54 - (float)(undefined4)uVar16));
      auVar40 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar53,auVar44);
      auVar41 = ZEXT416((uint)(auVar52._0_4_ * auVar51._0_4_));
      auVar44 = vfmsub213ss_fma(auVar44,ZEXT416((uint)(fVar85 - fVar75)),auVar41);
      auVar51 = vfnmadd213ss_fma(auVar51,auVar52,auVar41);
      fVar85 = auVar44._0_4_ + auVar51._0_4_;
      auVar76._0_4_ = auVar43._0_4_ * auVar40._0_4_;
      auVar76._4_4_ = auVar43._4_4_ * auVar40._4_4_;
      auVar76._8_4_ = auVar43._8_4_ * auVar40._8_4_;
      auVar76._12_4_ = auVar43._12_4_ * auVar40._12_4_;
      auVar51 = vfmsub213ps_fma(auVar53,auVar52,auVar76);
      auVar52 = vfnmadd213ps_fma(auVar40,auVar43,auVar76);
      local_170 = 0.0;
      auVar83._0_4_ = auVar52._0_4_ + auVar51._0_4_;
      auVar83._4_4_ = auVar52._4_4_ + auVar51._4_4_;
      auVar83._8_4_ = auVar52._8_4_ + auVar51._8_4_;
      auVar83._12_4_ = auVar52._12_4_ + auVar51._12_4_;
      auVar70._0_4_ = auVar83._0_4_ * auVar83._0_4_;
      auVar70._4_4_ = auVar83._4_4_ * auVar83._4_4_;
      auVar70._8_4_ = auVar83._8_4_ * auVar83._8_4_;
      auVar70._12_4_ = auVar83._12_4_ * auVar83._12_4_;
      auVar51 = vmovshdup_avx(auVar70);
      fVar54 = auVar70._0_4_ + fVar85 * fVar85 + auVar51._0_4_;
      fVar75 = 0.0;
      auVar73 = ZEXT1264(ZEXT812(0));
      if ((fVar54 != 0.0) || (NAN(fVar54))) {
        auVar71._8_4_ = 0x3f800000;
        auVar71._0_8_ = 0x3f8000003f800000;
        auVar71._12_4_ = 0x3f800000;
        auVar78._8_4_ = 0x80000000;
        auVar78._0_8_ = 0x8000000080000000;
        auVar78._12_4_ = 0x80000000;
        auVar52 = vpternlogd_avx512vl(auVar71,auVar83,auVar78,0xf8);
        fVar68 = auVar52._0_4_;
        auVar87._0_4_ = -1.0 / (auVar83._0_4_ + fVar68);
        auVar87._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar51 = vmovshdup_avx(auVar83);
        fVar75 = auVar51._0_4_;
        fVar54 = fVar85 * fVar75 * auVar87._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar68 * fVar75 * fVar75)),auVar87,auVar71);
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar85 * fVar85)),auVar87,auVar52);
        auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)(fVar68 * fVar54)),0x10);
        auVar73 = ZEXT1664(auVar51);
        local_170 = -fVar85;
        auVar77 = vinsertps_avx(ZEXT416((uint)fVar54),auVar52,0x10);
        fVar75 = -fVar68 * fVar75;
      }
    }
  }
  local_178 = vmovlps_avx(auVar77);
  dndvs.super_Tuple3<pbrt::Normal3,_float>.z = local_170;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_178;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_178 >> 0x20);
  ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar57._0_8_;
  dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar48._0_8_;
  dpdus.super_Tuple3<pbrt::Vector3,_float>.z = fVar60;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar47._0_8_;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = auVar67._0_4_;
  dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar73._0_8_;
  dndus.super_Tuple3<pbrt::Normal3,_float>.z = fVar75;
  SurfaceInteraction::SetShadingGeometry(this,ns,dpdus,dpdvs,dndus,dndvs,true);
  return this;
}

Assistant:

InteractionFromIntersection(const TriangleMesh *mesh,
                                                          int triIndex,
                                                          const TriangleIntersection &ti,
                                                          Float time,
                                                          const Vector3f &wo) {
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];
        // Compute triangle partial derivatives
        // Compute deltas and matrix determinant for triangle partial derivatives
        // Get triangle texture coordinates in _uv_ array
        pstd::array<Point2f, 3> uv =
            mesh->uv
                ? pstd::array<Point2f, 3>(
                      {mesh->uv[v[0]], mesh->uv[v[1]], mesh->uv[v[2]]})
                : pstd::array<Point2f, 3>({Point2f(0, 0), Point2f(1, 0), Point2f(1, 1)});

        Vector2f duv02 = uv[0] - uv[2], duv12 = uv[1] - uv[2];
        Vector3f dp02 = p0 - p2, dp12 = p1 - p2;
        Float determinant = DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);

        Vector3f dpdu, dpdv;
        bool degenerateUV = std::abs(determinant) < 1e-9f;
        if (!degenerateUV) {
            // Compute triangle $\dpdu$ and $\dpdv$ via matrix inversion
            Float invdet = 1 / determinant;
            dpdu = DifferenceOfProducts(duv12[1], dp02, duv02[1], dp12) * invdet;
            dpdv = DifferenceOfProducts(duv02[0], dp12, duv12[0], dp02) * invdet;
        }
        // Handle degenerate triangle $(u,v)$ parameterization or partial derivatives
        if (degenerateUV || LengthSquared(Cross(dpdu, dpdv)) == 0) {
            Vector3f ng = Cross(p2 - p0, p1 - p0);
            if (LengthSquared(ng) == 0) {
                ng = Vector3f(Cross(Vector3<double>(p2 - p0), Vector3<double>(p1 - p0)));
                CHECK_NE(LengthSquared(ng), 0);
            }
            CoordinateSystem(Normalize(ng), &dpdu, &dpdv);
        }

        // Interpolate $(u,v)$ parametric coordinates and hit point
        Point3f pHit = ti.b0 * p0 + ti.b1 * p1 + ti.b2 * p2;
        Point2f uvHit = ti.b0 * uv[0] + ti.b1 * uv[1] + ti.b2 * uv[2];

        // Return _SurfaceInteraction_ for triangle hit
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[triIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        // Compute error bounds _pError_ for triangle intersection
        Float xAbsSum =
            (std::abs(ti.b0 * p0.x) + std::abs(ti.b1 * p1.x) + std::abs(ti.b2 * p2.x));
        Float yAbsSum =
            (std::abs(ti.b0 * p0.y) + std::abs(ti.b1 * p1.y) + std::abs(ti.b2 * p2.y));
        Float zAbsSum =
            (std::abs(ti.b0 * p0.z) + std::abs(ti.b1 * p1.z) + std::abs(ti.b2 * p2.z));
        Vector3f pError = gamma(7) * Vector3f(xAbsSum, yAbsSum, zAbsSum);

        SurfaceInteraction isect(Point3fi(pHit, pError), uvHit, wo, dpdu, dpdv,
                                 Normal3f(), Normal3f(), time, flipNormal, faceIndex);
        // Set final surface normal and shading geometry for triangle
        // Override surface normal in _isect_ for triangle
        isect.n = isect.shading.n = Normal3f(Normalize(Cross(dp02, dp12)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            isect.n = isect.shading.n = -isect.n;

        if (mesh->n || mesh->s) {
            // Initialize _Triangle_ shading geometry
            // Compute shading normal _ns_ for triangle
            Normal3f ns;
            if (mesh->n != nullptr) {
                ns =
                    ti.b0 * mesh->n[v[0]] + ti.b1 * mesh->n[v[1]] + ti.b2 * mesh->n[v[2]];
                ns = LengthSquared(ns) > 0 ? Normalize(ns) : isect.n;
            } else
                ns = isect.n;

            // Compute shading tangent _ss_ for triangle
            Vector3f ss;
            if (mesh->s != nullptr) {
                ss =
                    ti.b0 * mesh->s[v[0]] + ti.b1 * mesh->s[v[1]] + ti.b2 * mesh->s[v[2]];
                if (LengthSquared(ss) == 0)
                    ss = isect.dpdu;
            } else
                ss = isect.dpdu;

            // Compute shading bitangent _ts_ for triangle and adjust _ss_
            Vector3f ts = Cross(ns, ss);
            if (LengthSquared(ts) > 0)
                ss = Cross(ts, ns);
            else
                CoordinateSystem(ns, &ss, &ts);

            // Compute $\dndu$ and $\dndv$ for triangle shading geometry
            Normal3f dndu, dndv;
            if (mesh->n != nullptr) {
                // Compute deltas for triangle partial derivatives of normal
                Vector2f duv02 = uv[0] - uv[2];
                Vector2f duv12 = uv[1] - uv[2];
                Normal3f dn1 = mesh->n[v[0]] - mesh->n[v[2]];
                Normal3f dn2 = mesh->n[v[1]] - mesh->n[v[2]];

                Float determinant =
                    DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);
                bool degenerateUV = std::abs(determinant) < 1e-9;
                if (degenerateUV) {
                    // We can still compute dndu and dndv, with respect to the
                    // same arbitrary coordinate system we use to compute dpdu
                    // and dpdv when this happens. It's important to do this
                    // (rather than giving up) so that ray differentials for
                    // rays reflected from triangles with degenerate
                    // parameterizations are still reasonable.
                    Vector3f dn = Cross(Vector3f(mesh->n[v[2]] - mesh->n[v[0]]),
                                        Vector3f(mesh->n[v[1]] - mesh->n[v[0]]));

                    if (LengthSquared(dn) == 0)
                        dndu = dndv = Normal3f(0, 0, 0);
                    else {
                        Vector3f dnu, dnv;
                        CoordinateSystem(dn, &dnu, &dnv);
                        dndu = Normal3f(dnu);
                        dndv = Normal3f(dnv);
                    }
                } else {
                    Float invDet = 1 / determinant;
                    dndu = DifferenceOfProducts(duv12[1], dn1, duv02[1], dn2) * invDet;
                    dndv = DifferenceOfProducts(duv02[0], dn2, duv12[0], dn1) * invDet;
                }
            } else
                dndu = dndv = Normal3f(0, 0, 0);

            isect.SetShadingGeometry(ns, ss, ts, dndu, dndv, true);
        }

        return isect;
    }